

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O0

LispPTR n_new_cursorin(DLword *baseaddr,int dx,int dy,int w,int h)

{
  int h_local;
  int w_local;
  int dy_local;
  int dx_local;
  DLword *baseaddr_local;
  
  if ((baseaddr < DisplayRegion68k) || (DISP_MAX_Address < baseaddr)) {
    baseaddr_local._4_4_ = 0;
  }
  else if ((((dx < (int)(*EmMouseX68K + 0x32)) && ((int)(*EmMouseX68K - 0x32) < dx + w)) &&
           (dy < (int)(*EmMouseY68K + 0x32))) && ((int)(*EmMouseY68K - 0x32) < dy + h)) {
    baseaddr_local._4_4_ = 1;
  }
  else {
    baseaddr_local._4_4_ = 0;
  }
  return baseaddr_local._4_4_;
}

Assistant:

LispPTR n_new_cursorin(DLword *baseaddr, int dx, int dy, int w, int h) {
  extern DLword *DisplayRegion68k;

#ifdef INIT
  init_kbd_startup; /* MUST START KBD FOR INIT BEFORE FIRST BITBLT */
#endif

  if (in_display_segment(baseaddr)) {
    if ((dx < MOUSEXR) && (dx + w > MOUSEXL) && (dy < MOUSEYH) && (dy + h > MOUSEYL))
      return (T);
    else
      return (NIL);
  } else
    return (NIL);
}